

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::computeDualInfeasInPrimal(HModel *this,int *dualInfeasCount)

{
  double dVar1;
  pointer pdVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  pdVar2 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 0;
  uVar3 = (ulong)(uint)this->numTot;
  if (this->numTot < 1) {
    uVar3 = uVar4;
  }
  iVar5 = 0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    if ((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4] != 0) {
      dVar1 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4];
      if ((((dVar1 == -1e+200) && (!NAN(dVar1))) &&
          (dVar1 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4], dVar1 == 1e+200)) && (!NAN(dVar1))) {
        iVar5 = (iVar5 + 1) - (uint)(ABS(pdVar2[uVar4]) < this->dblOption[2]);
      }
      iVar5 = (iVar5 + 1) -
              (uint)(-this->dblOption[2] <
                    (double)(this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar4] * pdVar2[uVar4]);
    }
  }
  *dualInfeasCount = iVar5;
  return;
}

Assistant:

void HModel::computeDualInfeasInPrimal(int *dualInfeasCount) {
    int workCount = 0;
    const double inf = HSOL_CONST_INF;
    const double tau_d = dblOption[DBLOPT_DUAL_TOL];
    for (int i = 0; i < numTot; i++) {
        // Only for non basic variables
        if (!nonbasicFlag[i])
            continue;
        // Free
        if (workLower[i] == -inf && workUpper[i] == inf)
            workCount += (fabs(workDual[i]) >= tau_d);
        // In primal don't assume flip
        workCount += (nonbasicMove[i] * workDual[i] <= -tau_d);
    }
    *dualInfeasCount = workCount;
}